

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-type.cpp
# Opt level: O0

void __thiscall wasm::Type::Type(Type *this,Tuple *tuple)

{
  Type TVar1;
  Tuple *tuple_local;
  Type *this_local;
  
  anon_unknown_0::validateTuple(tuple);
  TVar1 = anon_unknown_0::TupleStore::insert
                    ((TupleStore *)wasm::(anonymous_namespace)::globalTupleStore,tuple);
  this->id = (uintptr_t)TVar1;
  return;
}

Assistant:

Type::Type(const Tuple& tuple) {
  validateTuple(tuple);
  new (this) Type(globalTupleStore.insert(tuple));
}